

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageValidType_Test::
~LiteTest_DownCastMessageValidType_Test(LiteTest_DownCastMessageValidType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageValidType) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;
  EXPECT_EQ(&test_type_1, DownCastMessage<CastType1>(test_type_1_pointer));

  const MessageLite* test_type_1_pointer_const = &test_type_1;
  EXPECT_EQ(&test_type_1,
            DownCastMessage<const CastType1>(test_type_1_pointer_const));

  MessageLite* test_type_1_pointer_nullptr = nullptr;
  EXPECT_EQ(nullptr, DownCastMessage<CastType1>(test_type_1_pointer_nullptr));

  MessageLite& test_type_1_pointer_ref = test_type_1;
  EXPECT_EQ(&test_type_1, &DownCastMessage<CastType1>(test_type_1_pointer_ref));

  const MessageLite& test_type_1_pointer_const_ref = test_type_1;
  EXPECT_EQ(&test_type_1,
            &DownCastMessage<CastType1>(test_type_1_pointer_const_ref));
}